

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::logFlushOrFinishAfterEnqueueEnd
          (CLIntercept *this,char *flushOrFinish,char *functionName,cl_int errorCode)

{
  mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  double __x;
  ostringstream ss;
  undefined1 auStack_1c8 [8];
  string local_1c0;
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"... ",4);
  if (flushOrFinish == (char *)0x0) {
    std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0[0] + -0x18) + 0x28);
  }
  else {
    sVar3 = strlen(flushOrFinish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,flushOrFinish,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," after ",7);
  if (functionName == (char *)0x0) {
    std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0[0] + -0x18) + 0x28);
  }
  else {
    sVar3 = strlen(functionName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,functionName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," returned ",10);
  CEnumNameMap::name_abi_cxx11_(&local_1c0,&this->m_EnumNameMap,errorCode);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,errorCode);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
  paVar1 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    __x = (double)std::__cxx11::stringbuf::str();
    log(this,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    return;
  }
  uVar5 = std::__throw_system_error(iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  _Unwind_Resume(uVar5);
}

Assistant:

void CLIntercept::logFlushOrFinishAfterEnqueueEnd(
    const char* flushOrFinish,
    const char* functionName,
    cl_int errorCode )
{
    std::ostringstream  ss;
    ss << "... " << flushOrFinish << " after " << functionName << " returned " << enumName().name( errorCode ) << " (" << errorCode << ")\n";

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( ss.str() );
}